

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webmenc.cc
# Opt level: O0

char * extract_encoder_settings(char *version,char **argv,int argc,char *input_fname)

{
  int iVar1;
  size_t sVar2;
  int in_EDX;
  long in_RSI;
  char *in_RDI;
  int num_skip_1;
  char *cur;
  char *result;
  int num_skip;
  int i;
  size_t total_size;
  char *in_stack_ffffffffffffffa8;
  char *local_48;
  int local_34;
  size_t local_30;
  char *local_8;
  
  local_30 = strlen(in_RDI);
  local_30 = local_30 + 9;
  local_34 = 1;
  while (local_34 < in_EDX) {
    iVar1 = anon_unknown.dwarf_134ca::skip_input_output_arg
                      (in_stack_ffffffffffffffa8,(char *)0x131e54);
    local_34 = iVar1 + local_34;
    if (iVar1 == 0) {
      sVar2 = strlen(*(char **)(in_RSI + (long)local_34 * 8));
      local_30 = sVar2 + 1 + local_30;
      local_34 = local_34 + 1;
    }
  }
  local_8 = (char *)malloc(local_30);
  if (local_8 == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    iVar1 = snprintf(local_8,local_30,"version:%s",in_RDI);
    local_48 = local_8 + iVar1;
    local_34 = 1;
    while (local_34 < in_EDX) {
      iVar1 = anon_unknown.dwarf_134ca::skip_input_output_arg
                        (in_stack_ffffffffffffffa8,(char *)0x131f21);
      local_34 = iVar1 + local_34;
      if (iVar1 == 0) {
        iVar1 = snprintf(local_48,local_30," %s",*(undefined8 *)(in_RSI + (long)local_34 * 8));
        local_48 = local_48 + iVar1;
        local_34 = local_34 + 1;
      }
    }
    *local_48 = '\0';
  }
  return local_8;
}

Assistant:

char *extract_encoder_settings(const char *version, const char **argv, int argc,
                               const char *input_fname) {
  // + 9 for "version:" prefix and for null terminator.
  size_t total_size = strlen(version) + 9;
  int i = 1;
  while (i < argc) {
    int num_skip = skip_input_output_arg(argv[i], input_fname);
    i += num_skip;
    if (num_skip == 0) {
      total_size += strlen(argv[i]) + 1;  // + 1 is for space separator.
      ++i;
    }
  }
  char *result = static_cast<char *>(malloc(total_size));
  if (result == nullptr) {
    return nullptr;
  }
  char *cur = result;
  cur += snprintf(cur, total_size, "version:%s", version);
  i = 1;
  while (i < argc) {
    int num_skip = skip_input_output_arg(argv[i], input_fname);
    i += num_skip;
    if (num_skip == 0) {
      cur += snprintf(cur, total_size, " %s", argv[i]);
      ++i;
    }
  }
  *cur = '\0';
  return result;
}